

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::BasicResult<void>::~BasicResult(BasicResult<void> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__BasicResult_00297068;
  ::std::__cxx11::string::~string((string *)(in_RDI + 2));
  ResultValueBase<void>::~ResultValueBase((ResultValueBase<void> *)0x192c34);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }